

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optTyped_moveConstructionForEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
::TestBody(optTyped_moveConstructionForEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
           *this)

{
  bool bVar1;
  value_type_conflict2 *default_value;
  char *message;
  AssertHelper local_40;
  AssertionResult gtest_ar_;
  AssertHelper local_28;
  type o2;
  
  o2.storage_ = 0.0;
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::
    opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>::
    value(&o2);
  }
  testing::Message::Message((Message *)&gtest_ar_);
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x1c1,
             "Expected: o2.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  default_value =
       &(this->
        super_optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
        ).value_2;
  local_40.data_ =
       (AssertHelperData *)
       mp::opt<double,mp::opt_null_type_policy<double,(anonymous_namespace)::null_floating<double>>>
       ::value_or<double_const&>
                 ((opt<double,mp::opt_null_type_policy<double,(anonymous_namespace)::null_floating<double>>>
                   *)&o2,default_value);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_,"this->value_2","o2.value_or(this->value_2)",default_value,
             (double *)&local_40);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x1c2,message);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TYPED_TEST(optTyped, moveConstructionForEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o1;
  auto o2{std::move(o1)};
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}